

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UResourceBundle * ures_findResource_63(char *path,UResourceBundle *fillIn,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  size_t sVar3;
  char *__dest;
  char *pcVar4;
  UResourceBundle *original;
  int32_t length;
  char *localeEnd;
  char *locale;
  char *save;
  char *pathToResource;
  char *packageName;
  UResourceBundle *result;
  UResourceBundle *first;
  UErrorCode *status_local;
  UResourceBundle *fillIn_local;
  char *path_local;
  
  pathToResource = (char *)0x0;
  path_local = (char *)fillIn;
  if ((status != (UErrorCode *)0x0) && (UVar1 = U_FAILURE(*status), UVar1 == '\0')) {
    sVar3 = strlen(path);
    iVar2 = (int)sVar3 + 1;
    __dest = (char *)uprv_malloc_63((long)iVar2);
    if (__dest == (char *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      memcpy(__dest,path,(long)iVar2);
      localeEnd = __dest;
      if (*__dest == '/') {
        pathToResource = __dest + 1;
        pcVar4 = strchr(pathToResource,0x2f);
        if (pcVar4 == (char *)0x0) {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
        }
        else {
          *pcVar4 = '\0';
          localeEnd = pcVar4 + 1;
        }
      }
      pcVar4 = strchr(localeEnd,0x2f);
      if (pcVar4 != (char *)0x0) {
        *pcVar4 = '\0';
      }
      original = ures_open_63(pathToResource,localeEnd,status);
      UVar1 = U_SUCCESS(*status);
      packageName = (char *)fillIn;
      if (UVar1 != '\0') {
        if (pcVar4 == (char *)0x0) {
          packageName = (char *)ures_copyResb_63(fillIn,original,status);
        }
        else {
          packageName = (char *)ures_findSubResource_63(original,pcVar4 + 1,fillIn,status);
        }
        ures_close_63(original);
      }
      uprv_free_63(__dest);
      path_local = packageName;
    }
  }
  return (UResourceBundle *)path_local;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2
ures_findResource(const char* path, UResourceBundle *fillIn, UErrorCode *status) 
{
  UResourceBundle *first = NULL; 
  UResourceBundle *result = fillIn;
  char *packageName = NULL;
  char *pathToResource = NULL, *save = NULL;
  char *locale = NULL, *localeEnd = NULL;
  int32_t length;

  if(status == NULL || U_FAILURE(*status)) {
    return result;
  }

  length = (int32_t)(uprv_strlen(path)+1);
  save = pathToResource = (char *)uprv_malloc(length*sizeof(char));
  /* test for NULL */
  if(pathToResource == NULL) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return result;
  }
  uprv_memcpy(pathToResource, path, length);

  locale = pathToResource;
  if(*pathToResource == RES_PATH_SEPARATOR) { /* there is a path specification */
    pathToResource++;
    packageName = pathToResource;
    pathToResource = uprv_strchr(pathToResource, RES_PATH_SEPARATOR);
    if(pathToResource == NULL) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    } else {
      *pathToResource = 0;
      locale = pathToResource+1;
    }
  }

  localeEnd = uprv_strchr(locale, RES_PATH_SEPARATOR);
  if(localeEnd != NULL) {
    *localeEnd = 0;
  }

  first = ures_open(packageName, locale, status);

  if(U_SUCCESS(*status)) {
    if(localeEnd) {
      result = ures_findSubResource(first, localeEnd+1, fillIn, status);
    } else {
      result = ures_copyResb(fillIn, first, status);
    }
    ures_close(first);
  }
  uprv_free(save);
  return result;
}